

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

bool __thiscall Functor::operator==(Functor *this,Functor *other)

{
  __type _Var1;
  bool local_19;
  Functor *other_local;
  Functor *this_local;
  
  _Var1 = std::operator==(&this->id,&other->id);
  local_19 = false;
  if (_Var1) {
    local_19 = this->arity == other->arity;
  }
  return local_19;
}

Assistant:

bool operator==(const Functor &other) const {
        return id == other.id && arity == other.arity;
    }